

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O1

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::GdiNv3::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,GdiNv3 *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  MthdSolidFormat *pMVar2;
  MthdOperation *pMVar3;
  MthdCtxSurf *pMVar4;
  MthdCtxPattern *pMVar5;
  SingleMthdTest *pSVar6;
  result_type rVar7;
  Test *pTVar8;
  MthdVtxXy *pMVar9;
  MthdClipXy *pMVar10;
  MthdIfcSize *pMVar11;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  undefined1 *local_810;
  long local_808;
  undefined1 local_800 [16];
  undefined1 *local_7f0;
  long local_7e8;
  undefined1 local_7e0 [16];
  undefined1 *local_7d0;
  long local_7c8;
  undefined1 local_7c0 [16];
  undefined1 *local_7b0;
  long local_7a8;
  undefined1 local_7a0 [23];
  allocator_type local_789;
  MthdIfcSize *local_788;
  MthdIfcSize *local_780;
  Test *local_778;
  MthdClipXy *local_770;
  MthdClipXy *local_768;
  MthdVtxXy *local_760;
  Test *local_758;
  Test *local_750;
  Test *local_748;
  MthdClipXy *local_740;
  Test *local_738;
  Test *local_730;
  Test *local_728;
  MthdSolidFormat *local_720;
  MthdOperation *local_718;
  Test *local_710;
  MthdCtxSurf *local_708;
  Test *local_700;
  Test *local_6f8;
  MthdCtxPattern *local_6f0;
  Test *local_6e8;
  Test *local_6e0;
  Test *local_6d8;
  Test *local_6d0;
  SingleMthdTest *local_6c8;
  _func_int **local_6c0;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_6b8;
  Test *local_6b0;
  MthdIfcSize *local_6a8;
  MthdIfcSize *local_6a0;
  MthdClipXy *local_698;
  MthdClipXy *local_690;
  MthdVtxXy *local_688;
  MthdIfcSize *local_680;
  MthdClipXy *local_678;
  MthdVtxXy *local_670;
  MthdVtxXy *local_668;
  MthdClipXy *local_660;
  MthdClipXy *local_658;
  MthdVtxXy *local_650;
  Test *local_648;
  undefined1 *local_640;
  long local_638;
  undefined1 local_630 [16];
  undefined1 *local_620;
  long local_618;
  undefined1 local_610 [16];
  undefined1 *local_600;
  long local_5f8;
  undefined1 local_5f0 [16];
  undefined1 *local_5e0;
  long local_5d8;
  undefined1 local_5d0 [16];
  undefined1 *local_5c0;
  long local_5b8;
  undefined1 local_5b0 [16];
  undefined1 *local_5a0;
  long local_598;
  undefined1 local_590 [16];
  undefined1 *local_580;
  long local_578;
  undefined1 local_570 [16];
  undefined1 *local_560;
  long local_558;
  undefined1 local_550 [16];
  undefined1 *local_540;
  long local_538;
  undefined1 local_530 [16];
  undefined1 *local_520;
  long local_518;
  undefined1 local_510 [16];
  undefined1 *local_500;
  long local_4f8;
  undefined1 local_4f0 [16];
  undefined1 *local_4e0;
  long local_4d8;
  undefined1 local_4d0 [16];
  undefined1 *local_4c0;
  long local_4b8;
  undefined1 local_4b0 [16];
  undefined1 *local_4a0;
  long local_498;
  undefined1 local_490 [16];
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  undefined1 *local_1a0;
  long local_198;
  undefined1 local_190 [16];
  SingleMthdTest *local_180;
  Test *local_178;
  Test *local_170;
  Test *local_168;
  Test *local_160;
  MthdCtxPattern *local_158;
  Test *local_150;
  Test *local_148;
  MthdCtxSurf *local_140;
  Test *local_138;
  MthdOperation *local_130;
  MthdSolidFormat *local_128;
  Test *local_120;
  Test *local_118;
  MthdVtxXy *local_110;
  Test *local_108;
  MthdClipXy *local_100;
  MthdClipXy *local_f8;
  Test *local_f0;
  MthdVtxXy *local_e8;
  MthdVtxXy *local_e0;
  MthdClipXy *local_d8;
  MthdClipXy *local_d0;
  Test *local_c8;
  MthdIfcSize *local_c0;
  MthdVtxXy *local_b8;
  Test *local_b0;
  MthdClipXy *local_a8;
  MthdClipXy *local_a0;
  Test *local_98;
  MthdIfcSize *local_90;
  MthdIfcSize *local_88;
  MthdVtxXy *local_80;
  Test *local_78;
  MthdClipXy *local_70;
  MthdClipXy *local_68;
  Test *local_60;
  Test *local_58;
  MthdIfcSize *local_50;
  MthdIfcSize *local_48;
  MthdVtxXy *local_40;
  Test *local_38;
  
  local_6b8 = __return_storage_ptr__;
  local_6c8 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_810 = local_800;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"nop","");
  pSVar6 = local_6c8;
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_6c8,opt,(uint32_t)rVar7);
  (pSVar6->super_MthdTest).trapbit = -1;
  (pSVar6->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  pSVar6->s_cls = uVar1;
  pSVar6->s_mthd = 0x100;
  pSVar6->s_stride = 4;
  pSVar6->s_num = 1;
  pSVar6->s_trapbit = -1;
  (pSVar6->name)._M_dataplus._M_p = (pointer)&(pSVar6->name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&pSVar6->name,local_810,local_810 + local_808)
  ;
  (pSVar6->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_003489c8;
  local_180 = pSVar6;
  local_6d0 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_7f0 = local_7e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"notify","");
  pTVar8 = local_6d0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_6d0,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_7f0,local_7f0 + local_7e8);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348bb8;
  local_178 = pTVar8;
  local_6d8 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_7d0 = local_7c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"patch","");
  pTVar8 = local_6d8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_6d8,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x10c;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_7d0,local_7d0 + local_7c8);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349758;
  local_170 = pTVar8;
  local_6e0 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_7b0 = local_7a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"pm_trigger","");
  pTVar8 = local_6e0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_6e0,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x140;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_7b0,local_7b0 + local_7a8);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a9f8;
  local_168 = pTVar8;
  local_6e8 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_4a0 = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"dma_notify","");
  pTVar8 = local_6e8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_6e8,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 1;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_4a0,local_4a0 + local_498);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349850;
  local_160 = pTVar8;
  local_6f0 = (MthdCtxPattern *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"ctx_pattern","");
  pMVar5 = local_6f0;
  MthdCtxPattern::MthdCtxPattern
            (local_6f0,opt,(uint32_t)rVar7,&local_1c0,3,(this->super_Class).cls,0x184,false);
  local_158 = pMVar5;
  local_6f8 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_4c0 = local_4b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"ctx_rop","");
  pTVar8 = local_6f8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_6f8,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x188;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 4;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_4c0,local_4c0 + local_4b8);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349a40;
  local_150 = pTVar8;
  local_700 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_4e0 = local_4d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"ctx_beta","");
  pTVar8 = local_700;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_700,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x18c;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 5;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_4e0,local_4e0 + local_4d8);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349b38;
  local_148 = pTVar8;
  local_708 = (MthdCtxSurf *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"ctx_dst","");
  pMVar4 = local_708;
  MthdCtxSurf::MthdCtxSurf(local_708,opt,(uint32_t)rVar7,&local_1e0,7,(this->super_Class).cls,400,0)
  ;
  local_140 = pMVar4;
  local_710 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_500 = local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"missing","");
  pTVar8 = local_710;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_710,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x200;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_500,local_500 + local_4f8);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a6b8;
  local_138 = pTVar8;
  local_718 = (MthdOperation *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"operation","");
  pMVar3 = local_718;
  MthdOperation::MthdOperation
            (local_718,opt,(uint32_t)rVar7,&local_200,8,(this->super_Class).cls,0x2fc,false);
  local_130 = pMVar3;
  local_720 = (MthdSolidFormat *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"format","");
  pMVar2 = local_720;
  MthdSolidFormat::MthdSolidFormat
            (local_720,opt,(uint32_t)rVar7,&local_220,9,(this->super_Class).cls,0x300,false);
  local_128 = pMVar2;
  local_728 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_520 = local_510;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"bitmap_format","");
  pTVar8 = local_728;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_728,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x304;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 10;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_520,local_520 + local_518);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a7b0;
  local_120 = pTVar8;
  pTVar8 = (Test *)operator_new(0x25950);
  local_648 = pTVar8;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_540 = local_530;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"a.color","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar8,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x3fc;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0xb;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_540,local_540 + local_538);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034c700;
  local_118 = pTVar8;
  pMVar9 = (MthdVtxXy *)operator_new(0x25958);
  local_650 = pMVar9;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"a.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar9,opt,(uint32_t)rVar7,&local_240,0xe,(this->super_Class).cls,0x400,0x40,8,0x11);
  local_110 = pMVar9;
  local_730 = (Test *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_560 = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"a.rect","");
  pTVar8 = local_730;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_730,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x404;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 8;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 0x40;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0xf;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_560,local_560 + local_558);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a070;
  *(undefined2 *)(pTVar8[0x1e].rnd._M_x + 0x119) = 0x101;
  local_108 = pTVar8;
  pMVar10 = (MthdClipXy *)operator_new(0x25958);
  local_658 = pMVar10;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"b.clip_xy_0","");
  MthdClipXy::MthdClipXy
            (pMVar10,opt,(uint32_t)rVar7,&local_260,0x10,(this->super_Class).cls,0x7f4,1,false);
  local_100 = pMVar10;
  pMVar10 = (MthdClipXy *)operator_new(0x25958);
  local_660 = pMVar10;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"b.clip_xy_1","");
  MthdClipXy::MthdClipXy
            (pMVar10,opt,(uint32_t)rVar7,&local_280,0x11,(this->super_Class).cls,0x7f8,1,true);
  local_f8 = pMVar10;
  local_738 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_580 = local_570;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"b.color","");
  pTVar8 = local_738;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_738,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x7fc;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0xb;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_580,local_580 + local_578);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034c700;
  local_f0 = pTVar8;
  pMVar9 = (MthdVtxXy *)operator_new(0x25958);
  local_668 = pMVar9;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"b.0.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar9,opt,(uint32_t)rVar7,&local_2a0,0x12,(this->super_Class).cls,0x800,0x40,8,1);
  local_e8 = pMVar9;
  pMVar9 = (MthdVtxXy *)operator_new(0x25958);
  local_670 = pMVar9;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"b.1.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar9,opt,(uint32_t)rVar7,&local_2c0,-1,(this->super_Class).cls,0x804,0x40,8,4);
  local_e0 = pMVar9;
  local_740 = (MthdClipXy *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"c.clip_xy_0","");
  pMVar10 = local_740;
  MthdClipXy::MthdClipXy
            (local_740,opt,(uint32_t)rVar7,&local_2e0,0x10,(this->super_Class).cls,0xbec,1,false);
  local_d8 = pMVar10;
  pMVar10 = (MthdClipXy *)operator_new(0x25958);
  local_678 = pMVar10;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"c.clip_xy_1","");
  MthdClipXy::MthdClipXy
            (pMVar10,opt,(uint32_t)rVar7,&local_300,0x11,(this->super_Class).cls,0xbf0,1,true);
  local_d0 = pMVar10;
  local_748 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_5a0 = local_590;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"c.color","");
  pTVar8 = local_748;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_748,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0xbf4;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0xc;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_5a0,local_5a0 + local_598);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034c8f0;
  local_c8 = pTVar8;
  pMVar11 = (MthdIfcSize *)operator_new(0x25958);
  local_680 = pMVar11;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"c.size","");
  MthdIfcSize::MthdIfcSize
            (pMVar11,opt,(uint32_t)rVar7,&local_320,0x15,(this->super_Class).cls,0xbf8,0x16);
  local_c0 = pMVar11;
  pMVar9 = (MthdVtxXy *)operator_new(0x25958);
  local_688 = pMVar9;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"c.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar9,opt,(uint32_t)rVar7,&local_340,0x14,(this->super_Class).cls,0xbfc,1,4,0x21);
  local_b8 = pMVar9;
  local_750 = (Test *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_5c0 = local_5b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c0,"c.bitmap_data","");
  pTVar8 = local_750;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_750,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0xc00;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 0x80;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0x18;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_5c0,local_5c0 + local_5b8);
  local_6c0 = (_func_int **)&PTR__SingleMthdTest_0034d108;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034d108;
  *(undefined1 *)(pTVar8[0x1e].rnd._M_x + 0x119) = 0;
  local_b0 = pTVar8;
  pMVar10 = (MthdClipXy *)operator_new(0x25958);
  local_690 = pMVar10;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"d.clip_xy_0","");
  MthdClipXy::MthdClipXy
            (pMVar10,opt,(uint32_t)rVar7,&local_360,0x10,(this->super_Class).cls,0xfe8,1,false);
  local_a8 = pMVar10;
  pMVar10 = (MthdClipXy *)operator_new(0x25958);
  local_698 = pMVar10;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"d.clip_xy_1","");
  MthdClipXy::MthdClipXy
            (pMVar10,opt,(uint32_t)rVar7,&local_380,0x11,(this->super_Class).cls,0xfec,1,true);
  local_a0 = pMVar10;
  local_758 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_5e0 = local_5d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"d.color","");
  pTVar8 = local_758;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_758,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0xff0;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0xc;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_5e0,local_5e0 + local_5d8);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034c8f0;
  local_98 = pTVar8;
  pMVar11 = (MthdIfcSize *)operator_new(0x25958);
  local_6a0 = pMVar11;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"d.size_in","");
  MthdIfcSize::MthdIfcSize
            (pMVar11,opt,(uint32_t)rVar7,&local_3a0,0x16,(this->super_Class).cls,0xff4,0x12);
  local_90 = pMVar11;
  pMVar11 = (MthdIfcSize *)operator_new(0x25958);
  local_6a8 = pMVar11;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"d.size_out","");
  MthdIfcSize::MthdIfcSize
            (pMVar11,opt,(uint32_t)rVar7,&local_3c0,0x17,(this->super_Class).cls,0xff8,0x14);
  local_88 = pMVar11;
  local_760 = (MthdVtxXy *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"d.xy","");
  pMVar9 = local_760;
  MthdVtxXy::MthdVtxXy
            (local_760,opt,(uint32_t)rVar7,&local_3e0,0x14,(this->super_Class).cls,0xffc,1,4,0x21);
  local_80 = pMVar9;
  pTVar8 = (Test *)operator_new(0x25958);
  local_6b0 = pTVar8;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_600 = local_5f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"d.bitmap_data","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar8,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x1000;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 0x80;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0x18;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_600,local_600 + local_5f8);
  pTVar8->_vptr_Test = local_6c0;
  *(undefined1 *)(pTVar8[0x1e].rnd._M_x + 0x119) = 0;
  local_78 = pTVar8;
  local_768 = (MthdClipXy *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"e.clip_xy_0","");
  pMVar10 = local_768;
  MthdClipXy::MthdClipXy
            (local_768,opt,(uint32_t)rVar7,&local_400,0x10,(this->super_Class).cls,0x13e4,1,false);
  local_70 = pMVar10;
  local_770 = (MthdClipXy *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"e.clip_xy_1","");
  pMVar10 = local_770;
  MthdClipXy::MthdClipXy
            (local_770,opt,(uint32_t)rVar7,&local_420,0x11,(this->super_Class).cls,0x13e8,1,true);
  local_68 = pMVar10;
  local_778 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_620 = local_610;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"e.color0","");
  pTVar8 = local_778;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_778,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x13ec;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0xd;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_620,local_620 + local_618);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034c7f8;
  local_60 = pTVar8;
  pTVar8 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_640 = local_630;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_640,"e.color1","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar8,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x13f0;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0xc;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_640,local_640 + local_638);
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034c8f0;
  local_58 = pTVar8;
  local_780 = (MthdIfcSize *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"e.size_in","");
  pMVar11 = local_780;
  MthdIfcSize::MthdIfcSize
            (local_780,opt,(uint32_t)rVar7,&local_440,0x16,(this->super_Class).cls,0x13f4,0x12);
  local_50 = pMVar11;
  local_788 = (MthdIfcSize *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"e.size_out","");
  pMVar11 = local_788;
  MthdIfcSize::MthdIfcSize
            (local_788,opt,(uint32_t)rVar7,&local_460,0x17,(this->super_Class).cls,0x13f8,0x14);
  local_48 = pMVar11;
  pMVar9 = (MthdVtxXy *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"e.xy","");
  MthdVtxXy::MthdVtxXy
            (pMVar9,opt,(uint32_t)rVar7,&local_480,0x14,(this->super_Class).cls,0x13fc,1,4,0x21);
  local_40 = pMVar9;
  pTVar8 = (Test *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1a0 = local_190;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"e.bitmap_data","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar8,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar8->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar8[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x894) = 0x1400;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar8[0x1e].rnd._M_x + 0x89c) = 0x80;
  *(undefined4 *)(pTVar8[0x1e].rnd._M_x + 0x114) = 0x19;
  pTVar8[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar8[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar8[0x1e].rnd._M_x + 0x115),local_1a0,local_1a0 + local_198);
  pTVar8->_vptr_Test = local_6c0;
  *(undefined1 *)(pTVar8[0x1e].rnd._M_x + 0x119) = 1;
  __l._M_len = 0x2a;
  __l._M_array = &local_180;
  local_38 = pTVar8;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_6b8,__l,&local_789);
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  if (local_640 != local_630) {
    operator_delete(local_640);
  }
  if (local_620 != local_610) {
    operator_delete(local_620);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p);
  }
  if (local_600 != local_5f0) {
    operator_delete(local_600);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p);
  }
  if (local_5e0 != local_5d0) {
    operator_delete(local_5e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if (local_5c0 != local_5b0) {
    operator_delete(local_5c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  if (local_5a0 != local_590) {
    operator_delete(local_5a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p);
  }
  if (local_580 != local_570) {
    operator_delete(local_580);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  if (local_560 != local_550) {
    operator_delete(local_560);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if (local_540 != local_530) {
    operator_delete(local_540);
  }
  if (local_520 != local_510) {
    operator_delete(local_520);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if (local_500 != local_4f0) {
    operator_delete(local_500);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if (local_4e0 != local_4d0) {
    operator_delete(local_4e0);
  }
  if (local_4c0 != local_4b0) {
    operator_delete(local_4c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if (local_4a0 != local_490) {
    operator_delete(local_4a0);
  }
  if (local_7b0 != local_7a0) {
    operator_delete(local_7b0);
  }
  if (local_7d0 != local_7c0) {
    operator_delete(local_7d0);
  }
  if (local_7f0 != local_7e0) {
    operator_delete(local_7f0);
  }
  if (local_810 != local_800) {
    operator_delete(local_810);
  }
  return local_6b8;
}

Assistant:

std::vector<SingleMthdTest *> GdiNv3::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdPatch(opt, rnd(), "patch", -1, cls, 0x10c),
		new MthdPmTrigger(opt, rnd(), "pm_trigger", -1, cls, 0x140),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdCtxPattern(opt, rnd(), "ctx_pattern", 3, cls, 0x184, false),
		new MthdCtxRop(opt, rnd(), "ctx_rop", 4, cls, 0x188),
		new MthdCtxBeta(opt, rnd(), "ctx_beta", 5, cls, 0x18c),
		new MthdCtxSurf(opt, rnd(), "ctx_dst", 7, cls, 0x190, 0),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200),
		new MthdOperation(opt, rnd(), "operation", 8, cls, 0x2fc, false),
		new MthdSolidFormat(opt, rnd(), "format", 9, cls, 0x300, false),
		new MthdBitmapFormat(opt, rnd(), "bitmap_format", 10, cls, 0x304),
		new MthdSolidColor(opt, rnd(), "a.color", 11, cls, 0x3fc),
		new MthdVtxXy(opt, rnd(), "a.xy", 14, cls, 0x400, 0x40, 8, VTX_FIRST | VTX_NOCLIP),
		new MthdRect(opt, rnd(), "a.rect", 15, cls, 0x404, 0x40, 8, VTX_DRAW | VTX_NOCLIP),
		new MthdClipXy(opt, rnd(), "b.clip_xy_0", 16, cls, 0x7f4, 1, 0),
		new MthdClipXy(opt, rnd(), "b.clip_xy_1", 17, cls, 0x7f8, 1, 1),
		new MthdSolidColor(opt, rnd(), "b.color", 11, cls, 0x7fc),
		new MthdVtxXy(opt, rnd(), "b.0.xy", 18, cls, 0x800, 0x40, 8, VTX_FIRST),
		new MthdVtxXy(opt, rnd(), "b.1.xy", -1, cls, 0x804, 0x40, 8, VTX_DRAW),
		new MthdClipXy(opt, rnd(), "c.clip_xy_0", 16, cls, 0xbec, 1, 0),
		new MthdClipXy(opt, rnd(), "c.clip_xy_1", 17, cls, 0xbf0, 1, 1),
		new MthdBitmapColor1(opt, rnd(), "c.color", 12, cls, 0xbf4),
		new MthdIfcSize(opt, rnd(), "c.size", 21, cls, 0xbf8, IFC_IN | IFC_OUT | IFC_BITMAP),
		new MthdVtxXy(opt, rnd(), "c.xy", 20, cls, 0xbfc, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdBitmapData(opt, rnd(), "c.bitmap_data", 24, cls, 0xc00, 0x80, 4, false),
		new MthdClipXy(opt, rnd(), "d.clip_xy_0", 16, cls, 0xfe8, 1, 0),
		new MthdClipXy(opt, rnd(), "d.clip_xy_1", 17, cls, 0xfec, 1, 1),
		new MthdBitmapColor1(opt, rnd(), "d.color", 12, cls, 0xff0),
		new MthdIfcSize(opt, rnd(), "d.size_in", 22, cls, 0xff4, IFC_IN | IFC_BITMAP),
		new MthdIfcSize(opt, rnd(), "d.size_out", 23, cls, 0xff8, IFC_OUT | IFC_BITMAP),
		new MthdVtxXy(opt, rnd(), "d.xy", 20, cls, 0xffc, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdBitmapData(opt, rnd(), "d.bitmap_data", 24, cls, 0x1000, 0x80, 4, false),
		new MthdClipXy(opt, rnd(), "e.clip_xy_0", 16, cls, 0x13e4, 1, 0),
		new MthdClipXy(opt, rnd(), "e.clip_xy_1", 17, cls, 0x13e8, 1, 1),
		new MthdBitmapColor0(opt, rnd(), "e.color0", 13, cls, 0x13ec),
		new MthdBitmapColor1(opt, rnd(), "e.color1", 12, cls, 0x13f0),
		new MthdIfcSize(opt, rnd(), "e.size_in", 22, cls, 0x13f4, IFC_IN | IFC_BITMAP),
		new MthdIfcSize(opt, rnd(), "e.size_out", 23, cls, 0x13f8, IFC_OUT | IFC_BITMAP),
		new MthdVtxXy(opt, rnd(), "e.xy", 20, cls, 0x13fc, 1, 4, VTX_FIRST | VTX_IFC),
		new MthdBitmapData(opt, rnd(), "e.bitmap_data", 25, cls, 0x1400, 0x80, 4, true),
	};
}